

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O1

void __thiscall Js::ByteCodeWriter::AuxNoReg(ByteCodeWriter *this,OpCode op,uint byteOffset,int C1)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  uint local_38;
  int local_34;
  OpLayoutAuxNoReg data;
  
  CheckOpen(this);
  if ((this->m_auxiliaryData).currentOffset <= byteOffset) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeWriter.cpp"
                                ,0x9c3,"(byteOffset < m_auxiliaryData.GetCurrentOffset())",
                                "byteOffset < m_auxiliaryData.GetCurrentOffset()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  _local_38 = CONCAT44(C1,byteOffset);
  Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
  Data::Write(&this->m_byteCodeData,&local_38,8);
  return;
}

Assistant:

void ByteCodeWriter::AuxNoReg(OpCode op, uint byteOffset, int C1)
    {
        CheckOpen();

        //
        // Write the buffer's contents
        //

        Assert(byteOffset < m_auxiliaryData.GetCurrentOffset());

        OpLayoutAuxNoReg data;
        data.Offset = byteOffset;
        data.C1 = C1;

        m_byteCodeData.Encode(op, &data, sizeof(data), this);
    }